

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O2

void __thiscall
QAbstractItemModel::beginInsertColumns
          (QAbstractItemModel *this,QModelIndex *parent,int first,int last)

{
  QAbstractItemModelPrivate *this_00;
  long in_FS_OFFSET;
  Change local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemModelPrivate **)(this + 8);
  local_58.parent.m.ptr = (parent->m).ptr;
  local_58.parent.r = parent->r;
  local_58.parent.c = parent->c;
  local_58.parent.i = parent->i;
  local_58.needsAdjust = false;
  local_58.first = first;
  local_58.last = last;
  QList<QAbstractItemModelPrivate::Change>::emplaceBack<QAbstractItemModelPrivate::Change_const&>
            (&(this_00->changes).super_QList<QAbstractItemModelPrivate::Change>,&local_58);
  columnsAboutToBeInserted(this,parent,first);
  QAbstractItemModelPrivate::columnsAboutToBeInserted(this_00,parent,first,last);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::beginInsertColumns(const QModelIndex &parent, int first, int last)
{
    Q_ASSERT(first >= 0);
    Q_ASSERT(first <= columnCount(parent)); // == is allowed, to insert at the end
    Q_ASSERT(last >= first);
    Q_D(QAbstractItemModel);
    d->changes.push(QAbstractItemModelPrivate::Change(parent, first, last));
    emit columnsAboutToBeInserted(parent, first, last, QPrivateSignal());
    d->columnsAboutToBeInserted(parent, first, last);
}